

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O3

string * chaiscript::exception::eval_error::format
                   (string *__return_storage_ptr__,string *t_why,
                   vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                   *t_parameters,bool t_dot_notation,Dispatch_Engine *t_ss)

{
  Dispatch_Engine *t_ss_00;
  stringstream ss;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  t_ss_00 = t_ss;
  std::__cxx11::stringstream::stringstream(local_1b8);
  format_why(&local_1d8,t_why);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"With parameters: ",0x11);
  format_parameters_abi_cxx11_
            (&local_1d8,(eval_error *)t_parameters,
             (vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
             (ulong)t_dot_notation,SUB81(t_ss,0),t_ss_00);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8," ",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

static std::string format(const std::string &t_why, 
          const std::vector<Boxed_Value> &t_parameters, 
          bool t_dot_notation,
          const chaiscript::detail::Dispatch_Engine &t_ss)
      {
        std::stringstream ss;

        ss << format_why(t_why);
        ss << " ";

        ss << "With parameters: " << format_parameters(t_parameters, t_dot_notation, t_ss);
        ss << " ";

        return ss.str();
      }